

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

Error asmjit::EmitterUtils::logInstructionFailed
                (BaseAssembler *self,Error err,uint32_t instId,uint32_t options,Operand_ *o0,
                Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Error EVar1;
  char *str;
  undefined8 message;
  StringTmp<256UL> sb;
  Operand_ opArray [6];
  BaseInst local_1d8;
  anon_union_32_4_a21e1b61_for_String_0 local_1c8;
  char local_1a8 [272];
  Operand_ local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_1c8._large.data = local_1a8;
  local_1c8._large.size = 0;
  local_1c8._0_8_ = 0x20;
  local_1c8._large.capacity = 0x107;
  local_1a8[0] = '\0';
  str = DebugUtils::errorAsString(err);
  String::_opString((String *)&local_1c8._small,1,str,0xffffffffffffffff);
  String::_opString((String *)&local_1c8._small,1,": ",0xffffffffffffffff);
  local_98._signature = o0->_signature;
  local_98._baseId = o0->_baseId;
  local_98._data = *&o0->_data;
  local_88._0_4_ = o1->_signature;
  local_88._4_4_ = o1->_baseId;
  uStack_80 = *(undefined8 *)o1->_data;
  local_78._0_4_ = o2->_signature;
  local_78._4_4_ = o2->_baseId;
  uStack_70 = *(undefined8 *)o2->_data;
  local_68._0_4_ = opExt->_signature;
  local_68._4_4_ = opExt->_baseId;
  uStack_60 = *(undefined8 *)opExt->_data;
  local_58._0_4_ = opExt[1]._signature;
  local_58._4_4_ = opExt[1]._baseId;
  uStack_50 = *(undefined8 *)opExt[1]._data;
  local_48._0_4_ = opExt[2]._signature;
  local_48._4_4_ = opExt[2]._baseId;
  uStack_40 = *(undefined8 *)opExt[2]._data;
  local_1d8._extraReg = (self->super_BaseEmitter)._extraReg;
  local_1d8._id = instId;
  local_1d8._options = options;
  Formatter::formatInstruction
            ((String *)&local_1c8._small,0,&self->super_BaseEmitter,
             (uint)(self->super_BaseEmitter)._environment._arch,&local_1d8,&local_98,6);
  if ((self->super_BaseEmitter)._inlineComment != (char *)0x0) {
    String::_opString((String *)&local_1c8._small,1," ; ",0xffffffffffffffff);
    String::_opString((String *)&local_1c8._small,1,(self->super_BaseEmitter)._inlineComment,
                      0xffffffffffffffff);
  }
  (self->super_BaseEmitter)._instOptions = 0;
  (self->super_BaseEmitter)._extraReg._signature = 0;
  *(undefined8 *)&(self->super_BaseEmitter)._extraReg._id = 0;
  *(undefined4 *)((long)&(self->super_BaseEmitter)._inlineComment + 4) = 0;
  message = local_1c8._large.data;
  if (local_1c8._type < 0x1f) {
    message = local_1c8._small.data;
  }
  EVar1 = BaseEmitter::reportError(&self->super_BaseEmitter,err,(char *)message);
  String::reset((String *)&local_1c8._small);
  return EVar1;
}

Assistant:

Error logInstructionFailed(
  BaseAssembler* self,
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {

  StringTmp<256> sb;
  sb.append(DebugUtils::errorAsString(err));
  sb.append(": ");

  Operand_ opArray[Globals::kMaxOpCount];
  EmitterUtils::opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  Formatter::formatInstruction(sb, 0, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (self->inlineComment()) {
    sb.append(" ; ");
    sb.append(self->inlineComment());
  }

  self->resetInstOptions();
  self->resetExtraReg();
  self->resetInlineComment();
  return self->reportError(err, sb.data());
}